

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::UniformTypes::Run(UniformTypes *this)

{
  CallLogWrapper *this_00;
  GLenum *pGVar1;
  long lVar2;
  undefined8 src_vs;
  GLuint program;
  uint uVar3;
  mapped_type *pmVar4;
  long error;
  GLenum props [16];
  char *local_408;
  undefined4 local_400;
  undefined4 local_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined8 local_3ec;
  undefined1 local_3e4 [16];
  undefined8 local_3d4;
  GLint local_3cc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  undefined1 local_398 [36];
  undefined1 local_374 [16];
  undefined8 local_364;
  GLint local_35c;
  undefined1 local_358 [36];
  undefined1 local_334 [16];
  undefined8 local_324;
  GLint local_31c;
  undefined1 local_318 [36];
  undefined1 local_2f4 [16];
  undefined8 local_2e4;
  GLint local_2dc;
  undefined1 local_2d8 [36];
  undefined1 local_2b4 [16];
  undefined8 local_2a4;
  GLint local_29c;
  key_type local_298;
  undefined1 local_278 [36];
  undefined8 uStack_254;
  undefined1 local_24c [16];
  GLint local_23c;
  undefined1 local_238 [36];
  undefined8 uStack_214;
  undefined1 local_20c [16];
  GLint local_1fc;
  undefined1 local_1f8 [36];
  undefined8 uStack_1d4;
  undefined1 local_1cc [16];
  GLint local_1bc;
  undefined1 local_1b8 [36];
  undefined8 uStack_194;
  undefined1 local_18c [16];
  GLint local_17c;
  undefined1 local_178 [36];
  undefined8 uStack_154;
  undefined1 local_14c [16];
  GLint local_13c;
  undefined1 local_138 [36];
  undefined8 uStack_114;
  undefined1 local_10c [16];
  GLint local_fc;
  undefined1 local_f8 [36];
  undefined8 uStack_d4;
  undefined1 local_cc [16];
  GLint local_bc;
  undefined1 local_b8 [36];
  undefined8 uStack_94;
  undefined1 local_8c [16];
  GLint local_7c;
  undefined1 local_78 [36];
  undefined8 uStack_54;
  undefined1 local_4c [16];
  GLint local_3c;
  
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x16])(props,this);
  src_vs = props._0_8_;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x17])(&local_408,this);
  program = PIQBase::CreateProgram(&this->super_PIQBase,(char *)src_vs,local_408,false);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  pGVar1 = props + 4;
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  this_00 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram(&this->super_PIQBase,program);
  error = 0;
  uVar3 = (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x15])
                    (this,(ulong)program,0x8b86);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e1,0x92f5,(ulong)uVar3,&error);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e1,0x92f6,0xf,&error);
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indices._M_t._M_impl.super__Rb_tree_header._M_header;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  props._0_8_ = pGVar1;
  indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"a","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"b","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"c","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"d","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"e","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"f","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"g","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"h","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"i","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"j.b","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"k.b[0].c","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[0].c","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[2].b[1].d[0]","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[2].a.c","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e1,&indices,props,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"a","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"a","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"b","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"b","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"c[0]","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"d","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"d","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"e","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"e","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"f","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"f","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"g","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"g[0]","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"h","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"h","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"i","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"i","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"j.b","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"j.b","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"k.b[0].c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"k.b[0].c","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[0].c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"l[0].c","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[2].b[1].d[0]","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"l[2].b[1].d[0]","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[2].a.c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)props);
  uVar3 = *pmVar4;
  local_408 = (char *)&uStack_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"l[2].a.c","");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar3,&local_408,&error);
  if (local_408 != (char *)&uStack_3f8) {
    operator_delete(local_408,CONCAT44(uStack_3f4,uStack_3f8) + 1);
  }
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"a","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"a");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"b","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"b");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"c","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"d","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"d");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"e","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"e");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"f","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"f");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"g","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"h","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"h");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"i","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"i");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"j.b","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"j.b");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"k.b[0].c","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"k.b[0].c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[0].c","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"l[0].c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[2].b[1].d[0]","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"l[2].b[1].d[0]");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"l[2].a.c","");
  uVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"l[2].a.c");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)program,0x92e1,props,(ulong)uVar3,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props[0xc] = 0x9307;
  props[0xd] = 0x9308;
  props[0xe] = 0x9306;
  props[0xf] = 0x930e;
  props[8] = 0x9301;
  props[9] = 0x930b;
  props[10] = 0x930a;
  props[0xb] = 0x9309;
  props[4] = 0x92fd;
  props[5] = 0x92fe;
  props[6] = 0x92ff;
  props[7] = 0x9300;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x92fc;
  local_408 = (char *)0x8b5200000002;
  local_400 = 1;
  local_3fc = 0xffffffff;
  uStack_3f8 = 0xffffffff;
  uStack_3f4 = 0xffffffff;
  uStack_3f0 = 0xffffffff;
  local_3ec = 0xffffffff00000000;
  local_3e4 = (undefined1  [16])0x0;
  local_3d4 = 0x100000000;
  local_3cc = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"a");
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"a","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_2d8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,&local_408,&error);
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,CONCAT44(local_2d8._20_4_,local_2d8._16_4_) + 1);
  }
  local_2d8._0_8_ = (pointer)0x8b5400000002;
  local_2d8._8_4_ = 1;
  local_2d8._12_4_ = 0xffffffff;
  local_2d8._16_4_ = 0xffffffff;
  local_2d8._20_4_ = 0xffffffff;
  local_2d8._24_4_ = 0xffffffff;
  local_2d8._28_8_ = 0xffffffff00000000;
  local_2b4 = (undefined1  [16])0x0;
  local_2a4 = 0x100000000;
  local_29c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"b");
  local_318._0_8_ = local_318 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"b","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_318);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_2d8,&error)
  ;
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_,CONCAT44(local_318._20_4_,local_318._16_4_) + 1);
  }
  local_318._0_8_ = (pointer)0x8dc600000005;
  local_318._8_4_ = 3;
  local_318._12_4_ = 0xffffffff;
  local_318._16_4_ = 0xffffffff;
  local_318._20_4_ = 0xffffffff;
  local_318._24_4_ = 0xffffffff;
  local_318._28_8_ = 0xffffffff00000000;
  local_2f4 = (undefined1  [16])0x0;
  local_2e4 = 0x100000000;
  local_2dc = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"c");
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_78);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_318,&error)
  ;
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_78._20_4_,local_78._16_4_) + 1);
  }
  local_78._0_8_ = (pointer)0x8b5c00000002;
  local_78._8_4_ = 1;
  local_78._12_4_ = 0xffffffff;
  local_78._16_4_ = 0xffffffff;
  local_78._20_4_ = 0xffffffff;
  local_78._24_4_ = 0xffffffff;
  local_78._28_8_ = 0xffffffff00000000;
  uStack_54 = 0x100000000;
  local_4c = (undefined1  [16])0x0;
  local_3c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"d");
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"d","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_b8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_78,&error);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
  }
  local_b8._0_8_ = (pointer)0x8b5b00000002;
  local_b8._8_4_ = 1;
  local_b8._12_4_ = 0xffffffff;
  local_b8._16_4_ = 0xffffffff;
  local_b8._20_4_ = 0xffffffff;
  local_b8._24_4_ = 0xffffffff;
  local_b8._28_8_ = 0xffffffff00000000;
  uStack_94 = 0x100000000;
  local_8c = (undefined1  [16])0x0;
  local_7c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"e");
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"e","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_f8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_b8,&error);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,CONCAT44(local_f8._20_4_,local_f8._16_4_) + 1);
  }
  local_f8._0_8_ = (pointer)0x140400000002;
  local_f8._8_4_ = 1;
  local_f8._12_4_ = 0xffffffff;
  local_f8._16_4_ = 0xffffffff;
  local_f8._20_4_ = 0xffffffff;
  local_f8._24_4_ = 0xffffffff;
  local_f8._28_8_ = 0xffffffff00000000;
  uStack_d4 = 0x100000000;
  local_cc = (undefined1  [16])0x0;
  local_bc = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"f");
  local_358._0_8_ = local_358 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"f","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_358);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_f8,&error);
  if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
    operator_delete((void *)local_358._0_8_,CONCAT44(local_358._20_4_,local_358._16_4_) + 1);
  }
  local_358._0_8_ = (pointer)0x8b5a00000005;
  local_358._8_4_ = 8;
  local_358._12_4_ = 0xffffffff;
  local_358._16_4_ = 0xffffffff;
  local_358._20_4_ = 0xffffffff;
  local_358._24_4_ = 0xffffffff;
  local_358._28_8_ = 0xffffffff00000000;
  local_334 = (undefined1  [16])0x0;
  local_324 = 0x100000000;
  local_31c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"g");
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"g","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_138);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_358,&error)
  ;
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,CONCAT44(local_138._20_4_,local_138._16_4_) + 1);
  }
  local_138._0_8_ = (pointer)0x140600000002;
  local_138._8_4_ = 1;
  local_138._12_4_ = 0xffffffff;
  local_138._16_4_ = 0xffffffff;
  local_138._20_4_ = 0xffffffff;
  local_138._24_4_ = 0xffffffff;
  local_138._28_8_ = 0xffffffff00000000;
  uStack_114 = 0x100000000;
  local_10c = (undefined1  [16])0x0;
  local_fc = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"h");
  local_398._0_8_ = local_398 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"h","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_398);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_138,&error)
  ;
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,CONCAT44(local_398._20_4_,local_398._16_4_) + 1);
  }
  local_398._0_8_ = (pointer)0x8b6700000002;
  local_398._8_4_ = 1;
  local_398._12_4_ = 0xffffffff;
  local_398._16_4_ = 0xffffffff;
  local_398._20_4_ = 0xffffffff;
  local_398._24_4_ = 0xffffffff;
  local_398._28_8_ = 0xffffffff00000000;
  local_374 = (undefined1  [16])0x0;
  local_364 = 0x100000000;
  local_35c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"i");
  local_178._0_8_ = local_178 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"i","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_178);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_398,&error)
  ;
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,CONCAT44(local_178._20_4_,local_178._16_4_) + 1);
  }
  local_178._0_8_ = (pointer)0x8b5200000004;
  local_178._8_4_ = 1;
  local_178._12_4_ = 0xffffffff;
  local_178._16_4_ = 0xffffffff;
  local_178._20_4_ = 0xffffffff;
  local_178._24_4_ = 0xffffffff;
  local_178._28_8_ = 0xffffffff00000000;
  uStack_154 = 0x100000000;
  local_14c = (undefined1  [16])0x0;
  local_13c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"j.b");
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"j.b","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_1b8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_178,&error)
  ;
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1);
  }
  local_1b8._0_8_ = (pointer)0x8b5b00000009;
  local_1b8._8_4_ = 1;
  local_1b8._12_4_ = 0xffffffff;
  local_1b8._16_4_ = 0xffffffff;
  local_1b8._20_4_ = 0xffffffff;
  local_1b8._24_4_ = 0xffffffff;
  local_1b8._28_8_ = 0xffffffff00000000;
  uStack_194 = 0x100000000;
  local_18c = (undefined1  [16])0x0;
  local_17c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"k.b[0].c");
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"k.b[0].c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_1f8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_1b8,&error)
  ;
  if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
    operator_delete((void *)local_1f8._0_8_,CONCAT44(local_1f8._20_4_,local_1f8._16_4_) + 1);
  }
  local_1f8._0_8_ = (pointer)0x8dc600000007;
  local_1f8._8_4_ = 1;
  local_1f8._12_4_ = 0xffffffff;
  local_1f8._16_4_ = 0xffffffff;
  local_1f8._20_4_ = 0xffffffff;
  local_1f8._24_4_ = 0xffffffff;
  local_1f8._28_8_ = 0xffffffff00000000;
  uStack_1d4 = 0x100000000;
  local_1cc = (undefined1  [16])0x0;
  local_1bc = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"l[0].c");
  local_238._0_8_ = local_238 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"l[0].c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_238);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_1f8,&error)
  ;
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,CONCAT44(local_238._20_4_,local_238._16_4_) + 1);
  }
  local_238._0_8_ = (pointer)0x14060000000f;
  local_238._8_4_ = 2;
  local_238._12_4_ = 0xffffffff;
  local_238._16_4_ = 0xffffffff;
  local_238._20_4_ = 0xffffffff;
  local_238._24_4_ = 0xffffffff;
  local_238._28_8_ = 0xffffffff00000000;
  uStack_214 = 0x100000000;
  local_20c = (undefined1  [16])0x0;
  local_1fc = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"l[2].b[1].d[0]");
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"l[2].b[1].d[0]","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,(key_type *)local_278);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_238,&error)
  ;
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,CONCAT44(local_278._20_4_,local_278._16_4_) + 1);
  }
  local_278._0_8_ = (pointer)0x8b5b00000009;
  local_278._8_4_ = 1;
  local_278._12_4_ = 0xffffffff;
  local_278._16_4_ = 0xffffffff;
  local_278._20_4_ = 0xffffffff;
  local_278._24_4_ = 0xffffffff;
  local_278._28_8_ = 0xffffffff00000000;
  uStack_254 = 0x100000000;
  local_24c = (undefined1  [16])0x0;
  local_23c = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"l[2].a.c");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"l[2].a.c","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indices,&local_298);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar4,0x10,props,0x10,(key_type *)local_278,&error)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  lVar2 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indices._M_t);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		// only active structure members
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_ACTIVE_RESOURCES,
									GetProgramivRetValue(program, GL_ACTIVE_UNIFORMS), error);
		// l[2].b[1].d[0] and \0
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_MAX_NAME_LENGTH, 15, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "a", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "d", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "e", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "f", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "g", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "h", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "i", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "j.b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "k.b[0].c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "l[0].c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "l[2].b[1].d[0]", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "l[2].a.c", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["c"], "c[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["d"], "d", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["e"], "e", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["f"], "f", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["g"], "g[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["h"], "h", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["i"], "i", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["j.b"], "j.b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["k.b[0].c"], "k.b[0].c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["l[0].c"], "l[0].c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["l[2].b[1].d[0]"], "l[2].b[1].d[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["l[2].a.c"], "l[2].a.c", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", glGetUniformLocation(program, "a"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "b", glGetUniformLocation(program, "b"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "c", glGetUniformLocation(program, "c"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d", glGetUniformLocation(program, "d"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "e", glGetUniformLocation(program, "e"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "f", glGetUniformLocation(program, "f"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "g", glGetUniformLocation(program, "g"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "h", glGetUniformLocation(program, "h"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "i", glGetUniformLocation(program, "i"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "j.b", glGetUniformLocation(program, "j.b"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "k.b[0].c", glGetUniformLocation(program, "k.b[0].c"),
										 error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "l[0].c", glGetUniformLocation(program, "l[0].c"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "l[2].b[1].d[0]",
										 glGetUniformLocation(program, "l[2].b[1].d[0]"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "l[2].a.c", glGetUniformLocation(program, "l[2].a.c"),
										 error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = {
			2, GL_FLOAT_VEC4, 1, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "a")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["a"], 16, props, 16, expected, error);
		GLint expected2[] = { 2,  GL_INT_VEC3, 1, -1, -1, -1, -1, 0,
							  -1, 0,		   0, 0,  0,  0,  1,  glGetUniformLocation(program, "b") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["b"], 16, props, 16, expected2, error);
		GLint expected3[] = {
			5, GL_UNSIGNED_INT_VEC2, 3, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "c")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["c"], 16, props, 16, expected3, error);
		GLint expected4[] = {
			2, GL_FLOAT_MAT4, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "d")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["d"], 16, props, 16, expected4, error);
		GLint expected5[] = {
			2, GL_FLOAT_MAT3, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "e")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["e"], 16, props, 16, expected5, error);
		GLint expected6[] = {
			2, GL_INT, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "f")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["f"], 16, props, 16, expected6, error);
		GLint expected7[] = {
			5, GL_FLOAT_MAT2, 8, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "g")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["g"], 16, props, 16, expected7, error);
		GLint expected8[] = { 2,  GL_FLOAT, 1, -1, -1, -1, -1, 0,
							  -1, 0,		1, 0,  0,  0,  0,  glGetUniformLocation(program, "h") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["h"], 16, props, 16, expected8, error);
		GLint expected9[] = {
			2, GL_FLOAT_MAT3x2, 1, -1, -1, -1, -1, 0, -1, 0, 0, 0, 0, 0, 1, glGetUniformLocation(program, "i")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["i"], 16, props, 16, expected9, error);
		GLint expected10[] = {
			4, GL_FLOAT_VEC4, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "j.b")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["j.b"], 16, props, 16, expected10, error);
		GLint expected11[] = {
			9, GL_FLOAT_MAT3, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "k.b[0].c")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["k.b[0].c"], 16, props, 16, expected11, error);
		GLint expected12[] = { 7,  GL_UNSIGNED_INT_VEC2,
							   1,  -1,
							   -1, -1,
							   -1, 0,
							   -1, 0,
							   1,  0,
							   0,  0,
							   0,  glGetUniformLocation(program, "l[0].c") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["l[0].c"], 16, props, 16, expected12, error);
		GLint expected13[] = { 15, GL_FLOAT, 2, -1, -1, -1, -1, 0,
							   -1, 0,		 1, 0,  0,  0,  0,  glGetUniformLocation(program, "l[2].b[1].d[0]") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["l[2].b[1].d[0]"], 16, props, 16, expected13, error);
		GLint expected14[] = {
			9, GL_FLOAT_MAT3, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 0, 0, 0, glGetUniformLocation(program, "l[2].a.c")
		};
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["l[2].a.c"], 16, props, 16, expected14, error);

		glDeleteProgram(program);
		return error;
	}